

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleARGBRowDownEven_C
               (uint8_t *src_argb,ptrdiff_t src_stride,int src_stepx,uint8_t *dst_argb,int dst_width
               )

{
  int x;
  uint32_t *dst;
  uint32_t *src;
  int dst_width_local;
  uint8_t *dst_argb_local;
  int src_stepx_local;
  ptrdiff_t src_stride_local;
  uint8_t *src_argb_local;
  
  dst = (uint32_t *)dst_argb;
  src = (uint32_t *)src_argb;
  for (x = 0; x < dst_width + -1; x = x + 2) {
    *dst = *src;
    dst[1] = src[src_stepx];
    src = src + (src_stepx << 1);
    dst = dst + 2;
  }
  if ((dst_width & 1U) != 0) {
    *dst = *src;
  }
  return;
}

Assistant:

void ScaleARGBRowDownEven_C(const uint8_t* src_argb,
                            ptrdiff_t src_stride,
                            int src_stepx,
                            uint8_t* dst_argb,
                            int dst_width) {
  const uint32_t* src = (const uint32_t*)(src_argb);
  uint32_t* dst = (uint32_t*)(dst_argb);
  (void)src_stride;
  int x;
  for (x = 0; x < dst_width - 1; x += 2) {
    dst[0] = src[0];
    dst[1] = src[src_stepx];
    src += src_stepx * 2;
    dst += 2;
  }
  if (dst_width & 1) {
    dst[0] = src[0];
  }
}